

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_generic.c
# Opt level: O3

void gf_25519_sub(gf_25519_s *d,gf_25519_s *a,gf_25519_s *b)

{
  ulong uVar1;
  word_t wVar2;
  uint i;
  long lVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  
  lVar3 = 0;
  do {
    d->limb[lVar3] = a->limb[lVar3] - b->limb[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  uVar4 = d->limb[0] + 0x1fffffffffffb4;
  d->limb[0] = uVar4;
  lVar3 = 1;
  do {
    wVar2 = (d->limb + lVar3)[1];
    d->limb[lVar3] = d->limb[lVar3] + 0x1ffffffffffffc;
    (d->limb + lVar3)[1] = wVar2 + 0x1ffffffffffffc;
    lVar3 = lVar3 + 2;
  } while (lVar3 != 5);
  uVar1 = d->limb[4];
  auVar5._8_4_ = (int)uVar1;
  auVar5._0_8_ = uVar1;
  auVar5._12_4_ = (int)(uVar1 >> 0x20);
  lVar3 = 2;
  do {
    auVar7 = *(undefined1 (*) [16])(d->limb + lVar3);
    auVar8._0_8_ = auVar7._8_8_;
    auVar8._8_4_ = auVar7._0_4_;
    auVar8._12_4_ = auVar7._4_4_;
    auVar6._0_8_ = auVar5._8_8_ & 0x7ffffffffffff;
    auVar6._8_4_ = auVar7._8_4_;
    auVar6._12_4_ = auVar7._12_4_ & 0x7ffff;
    lVar9 = (auVar7._12_4_ >> 0x13) + auVar6._0_8_;
    auVar7._8_4_ = (int)lVar9;
    auVar7._0_8_ = (auVar8._8_8_ >> 0x33) + auVar6._8_8_;
    auVar7._12_4_ = (int)((ulong)lVar9 >> 0x20);
    *(undefined1 (*) [16])(d->limb + lVar3 + 1) = auVar7;
    lVar3 = lVar3 + -2;
    auVar5 = auVar8;
  } while (lVar3 != -2);
  d->limb[0] = (uVar1 >> 0x33) * 0x13 + (uVar4 & 0x7ffffffffffff);
  return;
}

Assistant:

void gf_sub (gf d, const gf a, const gf b) {
    gf_sub_RAW ( d, a, b );
    gf_bias( d, 2 );
    gf_weak_reduce ( d );
}